

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::equalityRowAdditions<HighsTripletPositionSlice>
          (HighsPostsolveStack *this,HighsInt addedEqRow,
          HighsMatrixSlice<HighsTripletPositionSlice> *eqRowVec,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *targetRows)

{
  HighsDataStack *this_00;
  int iVar1;
  int iVar2;
  pointer pNVar3;
  pointer pcVar4;
  pointer pcVar5;
  int iVar6;
  int *piVar7;
  double *pdVar8;
  long lVar9;
  size_t position;
  ReductionType local_55;
  HighsInt local_54;
  vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
  *local_50;
  double local_48;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *local_40;
  HighsInt *local_38;
  
  pNVar3 = (this->rowValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rowValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->rowValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  local_50 = (vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
              *)&this->rowValues;
  iVar1 = eqRowVec->len;
  local_54 = addedEqRow;
  local_40 = targetRows;
  if ((long)iVar1 != 0) {
    local_38 = eqRowVec->nodePositions;
    piVar7 = eqRowVec->nodeIndex;
    pdVar8 = eqRowVec->nodeValue;
    lVar9 = 0;
    iVar6 = 0;
    do {
      iVar2 = *(int *)((long)local_38 + lVar9);
      iVar6 = iVar2 - iVar6;
      piVar7 = piVar7 + iVar6;
      pdVar8 = pdVar8 + iVar6;
      local_48 = *pdVar8;
      std::
      vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
      ::emplace_back<int&,double>
                (local_50,(this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start + *piVar7,&local_48);
      lVar9 = lVar9 + 4;
      iVar6 = iVar2;
    } while ((long)iVar1 * 4 != lVar9);
  }
  this_00 = &this->reductionValues;
  pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_54];
  pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize
            (&this_00->data,(size_type)(pcVar4 + (4 - (long)pcVar5)));
  *(int *)(pcVar4 + ((long)(this->reductionValues).data.
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start - (long)pcVar5)) = iVar1;
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (this_00,(vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)local_50);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(this_00,local_40);
  local_55 = kEqualityRowAdditions;
  local_48 = (double)((long)(this->reductionValues).data.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->reductionValues).data.
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_55,(unsigned_long *)&local_48);
  return;
}

Assistant:

void equalityRowAdditions(HighsInt addedEqRow,
                            const HighsMatrixSlice<RowStorageFormat>& eqRowVec,
                            const std::vector<Nonzero>& targetRows) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : eqRowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(EqualityRowAdditions{origRowIndex[addedEqRow]});
    reductionValues.push(rowValues);
    reductionValues.push(targetRows);
    reductionAdded(ReductionType::kEqualityRowAdditions);
  }